

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

void __thiscall
rsg::VariableWrite::VariableWrite
          (VariableWrite *this,GeneratorState *state,ConstValueRangeAccess valueRange)

{
  Variable **ppVVar1;
  VariableManager *pVVar2;
  pointer ppVVar3;
  Random *this_00;
  ConstValueRangeAccess value;
  ValueRangeAccess valueRange_00;
  ConstValueRangeAccess value_00;
  undefined8 uVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  bool bVar7;
  int iVar8;
  Variable *variable;
  ValueEntry *pVVar9;
  pointer pSVar10;
  pointer pSVar11;
  Scalar *pSVar12;
  pointer ppVVar13;
  int ndx;
  int max;
  Scalar *pSVar14;
  pointer ppVVar15;
  ValueEntry *val;
  float fVar16;
  ValueRange infRange;
  ValueRange local_b8;
  
  ppVVar1 = &(this->super_VariableAccess).m_variable;
  (this->super_VariableAccess).m_variable = (Variable *)0x0;
  (this->super_VariableAccess).m_valueAccess.super_ConstStridedValueAccess<64>.m_type =
       (VariableType *)0x0;
  (this->super_VariableAccess).m_valueAccess.super_ConstStridedValueAccess<64>.m_value =
       (Scalar *)0x0;
  (this->super_VariableAccess).super_Expression._vptr_Expression =
       (_func_int **)&PTR__Expression_01e72c70;
  pVVar2 = state->m_varManager;
  local_b8.m_type.m_typeName._M_string_length = (size_type)valueRange.m_max;
  local_b8.m_type._0_8_ = valueRange.m_type;
  local_b8.m_type.m_typeName._M_dataplus._M_p = (pointer)valueRange.m_min;
  ppVVar15 = (pVVar2->m_entryCache).
             super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  do {
    ppVVar13 = ppVVar15;
    if (ppVVar15 ==
        (pVVar2->m_entryCache).
        super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
LAB_015dfaeb:
      sVar6 = local_b8.m_type.m_typeName._M_string_length;
      _Var5._M_p = local_b8.m_type.m_typeName._M_dataplus._M_p;
      uVar4 = local_b8.m_type._0_8_;
      ppVVar3 = (state->m_varManager->m_entryCache).
                super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      bVar7 = rsg::anon_unknown_0::canAllocateVariable(state,valueRange.m_type);
      if ((!bVar7) ||
         ((ppVVar15 != ppVVar3 &&
          (fVar16 = deRandom_getFloat(&state->m_random->m_rnd), 0.1 <= fVar16)))) {
        this_00 = state->m_random;
        pVVar9 = (ValueEntry *)0x0;
        max = 0;
        while (ppVVar15 != ppVVar3) {
          if ((max < 1) ||
             (iVar8 = de::Random::getInt(this_00,0,max), local_b8.m_type._0_8_ = uVar4,
             local_b8.m_type.m_typeName._M_dataplus._M_p = _Var5._M_p,
             local_b8.m_type.m_typeName._M_string_length = sVar6, iVar8 < 1)) {
            pVVar9 = *ppVVar15;
            local_b8.m_type._0_8_ = uVar4;
            local_b8.m_type.m_typeName._M_dataplus._M_p = _Var5._M_p;
            local_b8.m_type.m_typeName._M_string_length = sVar6;
          }
          do {
            ppVVar15 = ppVVar15 + 1;
            if (ppVVar15 == ppVVar13) break;
            bVar7 = rsg::anon_unknown_0::IsWritableSupersetEntry::operator()
                              ((IsWritableSupersetEntry *)&local_b8,*ppVVar15);
          } while (!bVar7);
          max = max + 1;
        }
        variable = pVVar9->m_variable;
      }
      else {
        variable = VariableManager::allocate(state->m_varManager,valueRange.m_type);
      }
      *ppVVar1 = variable;
      pVVar9 = VariableManager::getParentValue(state->m_varManager,variable);
      if (pVVar9 == (ValueEntry *)0x0) {
        ValueRange::ValueRange(&local_b8,&(*ppVVar1)->m_type);
        pSVar10 = local_b8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (local_b8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_b8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pSVar10 = (Scalar *)0x0;
        }
        pSVar11 = local_b8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (local_b8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_b8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pSVar11 = (Scalar *)0x0;
        }
        valueRange_00.super_ConstValueRangeAccess.m_min = pSVar10;
        valueRange_00.super_ConstValueRangeAccess.m_type = &local_b8.m_type;
        valueRange_00.super_ConstValueRangeAccess.m_max = pSVar11;
        rsg::anon_unknown_0::setInfiniteRange(valueRange_00);
        if (local_b8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_b8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_b8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_start = (Scalar *)0x0;
        }
        if (local_b8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_b8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_b8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_start = (Scalar *)0x0;
        }
        value_00.m_min =
             local_b8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
        value_00.m_type = &local_b8.m_type;
        value_00.m_max =
             local_b8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
        VariableManager::setValue(state->m_varManager,*ppVVar1,value_00);
        ValueRange::~ValueRange(&local_b8);
      }
      else {
        pSVar12 = (pVVar9->m_valueRange).m_min.
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pSVar14 = (pVVar9->m_valueRange).m_max.
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (pSVar12 ==
            (pVVar9->m_valueRange).m_min.
            super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pSVar12 = (Scalar *)0x0;
        }
        if (pSVar14 ==
            (pVVar9->m_valueRange).m_max.
            super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pSVar14 = (Scalar *)0x0;
        }
        value.m_min = pSVar12;
        value.m_type = &(pVVar9->m_valueRange).m_type;
        value.m_max = pSVar14;
        VariableManager::setValue(state->m_varManager,*ppVVar1,value);
      }
      return;
    }
    bVar7 = rsg::anon_unknown_0::IsWritableSupersetEntry::operator()
                      ((IsWritableSupersetEntry *)&local_b8,*ppVVar15);
    if (bVar7) {
      ppVVar13 = (pVVar2->m_entryCache).
                 super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_015dfaeb;
    }
    ppVVar15 = ppVVar15 + 1;
  } while( true );
}

Assistant:

VariableWrite::VariableWrite (GeneratorState& state, ConstValueRangeAccess valueRange)
{
	DE_ASSERT(!valueRange.getType().isVoid());

	// Find variable with range that is superset of given range
	IsWritableSupersetEntry::Iterator	first	= state.getVariableManager().getBegin(IsWritableSupersetEntry(valueRange));
	IsWritableSupersetEntry::Iterator	end		= state.getVariableManager().getEnd(IsWritableSupersetEntry(valueRange));

	const float	createOnAssignWeight	= 0.1f; // Will essentially create an unused variable
	bool		createVar				= canAllocateVariable(state, valueRange.getType()) && (first == end || getWeightedBool(state.getRandom(), createOnAssignWeight));

	if (createVar)
	{
		m_variable = state.getVariableManager().allocate(valueRange.getType());
		// \note Storage will be LOCAL
	}
	else
	{
		// Choose random
		DE_ASSERT(first != end);
		const ValueEntry* entry = state.getRandom().choose<const ValueEntry*>(first, end);
		m_variable = entry->getVariable();
	}

	DE_ASSERT(m_variable);

	// Reset value range.
	const ValueEntry* parentEntry = state.getVariableManager().getParentValue(m_variable);
	if (parentEntry)
	{
		// Use parent value range.
		state.getVariableManager().setValue(m_variable, parentEntry->getValueRange());
	}
	else
	{
		// Use infinite range.
		ValueRange infRange(m_variable->getType());
		setInfiniteRange(infRange);

		state.getVariableManager().setValue(m_variable, infRange.asAccess());
	}
}